

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_functions.cc
# Opt level: O0

int32_t absl::lts_20250127::cord_internal::get_cordz_mean_interval(void)

{
  memory_order __b;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  return (anonymous_namespace)::g_cordz_mean_interval;
}

Assistant:

int32_t get_cordz_mean_interval() {
  return g_cordz_mean_interval.load(std::memory_order_acquire);
}